

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetZeroBlob(Mem *pMem,int n)

{
  int local_14;
  int n_local;
  Mem *pMem_local;
  
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = 0x410;
  pMem->n = 0;
  local_14 = n;
  if (n < 0) {
    local_14 = 0;
  }
  (pMem->u).nZero = local_14;
  pMem->enc = '\x01';
  pMem->z = (char *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetZeroBlob(Mem *pMem, int n){
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Blob|MEM_Zero;
  pMem->n = 0;
  if( n<0 ) n = 0;
  pMem->u.nZero = n;
  pMem->enc = SQLITE_UTF8;
  pMem->z = 0;
}